

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O2

int run_test_pipe_listen_without_bind(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&server,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_listen((uv_stream_t *)&server,0x1000,(uv_connection_cb)0x0);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a == -0x16) {
      uv_close((uv_handle_t *)&server,close_cb);
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      eval_a = 1;
      eval_b = (int64_t)close_cb_called;
      if (eval_b == 1) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        eval_a = 0;
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        eval_b = (int64_t)iVar1;
        if (eval_b == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar5 = "uv_loop_close(uv_default_loop())";
        pcVar4 = "0";
        uVar3 = 0x8b;
      }
      else {
        pcVar5 = "close_cb_called";
        pcVar4 = "1";
        uVar3 = 0x89;
      }
    }
    else {
      pcVar5 = "UV_EINVAL";
      pcVar4 = "r";
      uVar3 = 0x83;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "r";
    uVar3 = 0x80;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(pipe_listen_without_bind) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server, SOMAXCONN, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}